

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_unk6c(envy_bios *bios)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint8_t uVar3;
  byte bVar4;
  envy_bios_power_unk6c_entry *peVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  long lVar14;
  
  uVar9 = (bios->power).unk6c.offset;
  iVar7 = -0x16;
  if ((ulong)uVar9 != 0) {
    if (uVar9 < bios->length) {
      uVar3 = bios->data[uVar9];
      (bios->power).unk6c.version = uVar3;
    }
    else {
      (bios->power).unk6c.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar3 = (bios->power).unk6c.version;
    }
    if (uVar3 == '\x10') {
      uVar8 = (bios->power).unk6c.offset;
      uVar9 = uVar8 + 1;
      uVar1 = bios->length;
      if (uVar9 < uVar1) {
        (bios->power).unk6c.hlen = bios->data[uVar9];
        iVar7 = 0;
      }
      else {
        (bios->power).unk6c.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
        uVar8 = (bios->power).unk6c.offset;
        uVar1 = bios->length;
        iVar7 = -0xe;
      }
      uVar9 = uVar8 + 2;
      if (uVar9 < uVar1) {
        (bios->power).unk6c.rlen = bios->data[uVar9];
        iVar11 = 0;
      }
      else {
        (bios->power).unk6c.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar9);
        uVar8 = (bios->power).unk6c.offset;
        uVar1 = bios->length;
        iVar11 = -0xe;
      }
      if (uVar8 + 3 < uVar1) {
        bVar4 = bios->data[uVar8 + 3];
        (bios->power).unk6c.entriesnum = bVar4;
        iVar6 = 0;
      }
      else {
        (bios->power).unk6c.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        bVar4 = (bios->power).unk6c.entriesnum;
        iVar6 = -0xe;
      }
      (bios->power).unk6c.valid = (iVar11 == 0 && iVar7 == 0) && iVar6 == 0;
      peVar5 = (envy_bios_power_unk6c_entry *)malloc((ulong)((uint)bVar4 * 4));
      (bios->power).unk6c.entries = peVar5;
      auVar2 = _DAT_00273c40;
      if (bVar4 != 0) {
        uVar9 = (uint)(bios->power).unk6c.rlen;
        lVar14 = (ulong)bVar4 - 1;
        auVar12._8_4_ = (int)lVar14;
        auVar12._0_8_ = lVar14;
        auVar12._12_4_ = (int)((ulong)lVar14 >> 0x20);
        iVar7 = (uint)(bios->power).unk6c.hlen + (bios->power).unk6c.offset;
        uVar10 = 0;
        auVar12 = auVar12 ^ _DAT_00273c40;
        auVar13 = _DAT_00273c30;
        do {
          auVar15 = auVar13 ^ auVar2;
          if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                      auVar12._4_4_ < auVar15._4_4_) & 1)) {
            *(int *)((long)&peVar5->offset + uVar10) = iVar7;
          }
          if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
              auVar15._12_4_ <= auVar12._12_4_) {
            *(uint *)((long)&peVar5[1].offset + uVar10) = uVar9 + iVar7;
          }
          lVar14 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar14 + 2;
          iVar7 = iVar7 + uVar9 * 2;
          uVar10 = uVar10 + 8;
        } while (((uint)bVar4 * 4 + 4 & 0xfffffff8) != uVar10);
      }
      iVar7 = 0;
    }
    else {
      envy_bios_parse_power_unk6c_cold_1();
    }
  }
  return iVar7;
}

Assistant:

int envy_bios_parse_power_unk6c(struct envy_bios *bios) {
	struct envy_bios_power_unk6c *unk6c = &bios->power.unk6c;
	int i, err = 0;

	if (!unk6c->offset)
		return -EINVAL;

	bios_u8(bios, unk6c->offset + 0x0, &unk6c->version);
	switch(unk6c->version) {
	case 0x10:
		err |= bios_u8(bios, unk6c->offset + 0x1, &unk6c->hlen);
		err |= bios_u8(bios, unk6c->offset + 0x2, &unk6c->rlen);
		err |= bios_u8(bios, unk6c->offset + 0x3, &unk6c->entriesnum);
		unk6c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown VOLTAGE DEVICE table version 0x%x\n", unk6c->version);
		return -EINVAL;
	};

	err = 0;
	unk6c->entries = malloc(unk6c->entriesnum * sizeof(struct envy_bios_power_unk6c_entry));
	for (i = 0; i < unk6c->entriesnum; i++) {
		uint32_t data = unk6c->offset + unk6c->hlen + i * unk6c->rlen;

		unk6c->entries[i].offset = data;
	}

	return 0;
}